

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O0

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::NewChangeBase(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__s;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  this->_vptr_NewChangeBase = (_func_int **)&PTR_createObjectDirectory_00114d40;
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->files);
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  Tools::getInstance();
  __s = (char *)std::__cxx11::string::data();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  std::operator+(__return_storage_ptr__,&local_40,".stn");
  this->path = __return_storage_ptr__;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this->path = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&this->shortHashName);
  return;
}

Assistant:

NewChangeBase() : path(this->path = new string(string(Tools::getInstance()->path->data()) + ".stn")) {}